

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.hpp
# Opt level: O1

double __thiscall tfs::TMatrix<double>::max(TMatrix<double> *this)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  
  pdVar1 = this->m_data;
  if ((((pdVar1 == (double *)0x0) || (this->m_end <= pdVar1)) || (this->m_count == 0)) ||
     (this->m_length == 0)) {
    report_problem("Error",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/barrettd[P]tfs_dnn/test/../src/Matrix.hpp"
                   ,"max",0x177,"empty matrix");
    dVar3 = 0.0;
  }
  else {
    dVar2 = *pdVar1;
    while (dVar3 = dVar2, pdVar1 = pdVar1 + 1, pdVar1 < this->m_end) {
      dVar2 = *pdVar1;
      if (*pdVar1 <= dVar3) {
        dVar2 = dVar3;
      }
    }
  }
  return dVar3;
}

Assistant:

inline T max( void ) const {                // Return maximum value.
            if( isEmpty()) {
                log_error( "empty matrix" );
                return 0;
            }
            const T *      data = m_data;
            const T * const end = m_end;
            
            T result = *data++;
            while( data < end ) {
                if( *data > result ) {
                    result = *data;
                }
                data++;
            }
            return result;
        }